

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O3

void zzHalfMod(word *b,word *a,word *mod,size_t n)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  word wVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar1 = *a;
  uVar2 = -(ulong)((uint)uVar1 & 1);
  uVar7 = *mod & uVar2;
  bVar8 = CARRY8(uVar7,uVar1);
  *b = uVar7 + uVar1 >> 1;
  if (1 < n) {
    wVar4 = *b;
    sVar5 = 1;
    do {
      uVar1 = a[sVar5];
      uVar6 = (ulong)bVar8 + a[sVar5];
      b[sVar5] = uVar6;
      uVar7 = mod[sVar5] & uVar2;
      uVar3 = uVar7 + uVar6;
      bVar8 = CARRY8(uVar7,uVar6) || CARRY8((ulong)bVar8,uVar1);
      b[sVar5 - 1] = uVar3 << 0x3f | wVar4;
      wVar4 = uVar3 >> 1;
      b[sVar5] = wVar4;
      sVar5 = sVar5 + 1;
    } while (n != sVar5);
  }
  b[n - 1] = b[n - 1] | (ulong)bVar8 << 0x3f;
  return;
}

Assistant:

void SAFE(zzHalfMod)(word b[], const word a[], const word mod[], size_t n)
{
	register word carry = 0;
	register word mask = 0;
	register word w;
	size_t i;
	// pre
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	ASSERT(wwIsDisjoint(mod, b, n));
	ASSERT(zzIsOdd(mod, n) && mod[n - 1] != 0);
	ASSERT(wwCmp(a, mod, n) < 0);
	// mask <- (a -- нечетное) ? WORD_MAX : WORD_0
	mask = WORD_0 - (a[0] & WORD_1);
	// b <- (a + mod & mask) / 2 [(a -- нечетное) ? (a + mod) / 2 : a / 2]
	w = mask & mod[0];
	b[0] = a[0] + w;
	carry = wordLess01(b[0], w);
	b[0] >>= 1;
	for(i = 1; i < n; ++i)
	{
		b[i] = a[i];
		b[i] += carry;
		carry = wordLess01(b[i], carry);
		w = mask & mod[i];
		b[i] += w;
		carry |= wordLess01(b[i], w);
		b[i - 1] |= (b[i] & WORD_1) << (B_PER_W - 1);
		b[i] >>= 1;
	}
	b[n - 1] |= carry << (B_PER_W - 1);
	// очистка
	carry = mask = w = 0;
}